

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cpp
# Opt level: O0

void __thiscall
entropy::entropy(entropy *this,float p_grid,float v_grid,int p_count,int v_count,float v,int _n)

{
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  allocator_type *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  allocator_type *__a;
  allocator_type *__n;
  allocator_type local_7d [93];
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  int local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  this_00 = (vector<int,_std::allocator<int>_> *)(long)in_ESI;
  __n = in_RDI;
  local_20 = in_ECX;
  local_1c = in_XMM2_Da;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  std::allocator<int>::allocator((allocator<int> *)0x126b6f);
  std::vector<int,_std::allocator<int>_>::vector(this_00,(size_type)__n,in_RDI);
  __a = local_7d;
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x126b94);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)this_00,(size_type)__n,(value_type *)in_RDI,__a);
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
               *)0x126bbe);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)this_00,(size_type)__n,(value_type *)in_RDI,(allocator_type *)__a);
  std::
  allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
               *)0x126bea);
  std::
  vector<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
            *)this_00,(size_type)__n,(value_type *)in_RDI,(allocator_type *)__a);
  std::
  allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                *)0x126c11);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)in_RDI);
  std::
  allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)0x126c28);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)in_RDI);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)0x126c3c);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  std::allocator<int>::~allocator((allocator<int> *)0x126c50);
  *(undefined4 *)(__n + 0x20) = local_c;
  *(undefined4 *)(__n + 0x18) = local_10;
  *(int *)(__n + 0x24) = local_14;
  *(undefined4 *)(__n + 0x1c) = local_18;
  *(undefined4 *)(__n + 0x28) = local_1c;
  *(undefined4 *)(__n + 0x2c) = local_20;
  return;
}

Assistant:

entropy::entropy(float p_grid, float v_grid, int p_count, int v_count, float v, int _n) :
    boxes(p_count, vector<vector<vector<int>>>(p_count, vector<vector<int>>(v_count, vector<int>(v_count))))
{
    position_box_size = p_grid;
    velocity_box_size = v_grid;
    position_box_count = p_count;
    velocity_box_count = v_count;
    velocity_limit = v;
    n = _n;
}